

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perceptron.hpp
# Opt level: O2

void __thiscall Preceptron_SIGMOID::Backward(Preceptron_SIGMOID *this)

{
  pointer pdVar1;
  long lVar2;
  int i;
  long lVar3;
  ulong uVar4;
  double extraout_XMM0_Qa;
  double dVar5;
  double dVar6;
  
  pdVar1 = (this->super_Preceptron).weight.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (uVar4 = 0;
      uVar4 < (ulong)((long)(this->super_Preceptron).weight.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
      uVar4 = uVar4 + 1) {
    (*(this->super_Preceptron)._vptr_Preceptron[2])
              ((this->super_Preceptron).input.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar4],this);
    dVar5 = (this->super_Preceptron).input.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar4] * extraout_XMM0_Qa *
            (this->super_Preceptron).error;
    pdVar1 = (this->super_Preceptron).weight.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar6 = pdVar1[uVar4] * dVar5;
    (this->super_Preceptron).delta_weight.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar4] = dVar6;
    pdVar1[uVar4] =
         dVar6 * (this->super_Preceptron).motivation +
         dVar5 * (this->super_Preceptron).learning_step + pdVar1[uVar4];
    (this->super_Preceptron).delta_bias.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar4] = extraout_XMM0_Qa * (this->super_Preceptron).error;
  }
  if ((this->super_Preceptron).useBias == true) {
    pdVar1 = (this->super_Preceptron).delta_bias.super__Vector_base<double,_std::allocator<double>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = (long)(this->super_Preceptron).delta_bias.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar1 >> 3;
    dVar5 = 0.0;
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
      dVar5 = dVar5 + pdVar1[lVar3];
    }
    (this->super_Preceptron).bias =
         (dVar5 / (double)lVar2) * (this->super_Preceptron).learning_step +
         (this->super_Preceptron).bias;
  }
  return;
}

Assistant:

void Backward() {
		for (int i = 0; i < weight.size(); i++) {
			double derivation = Derivation(input[i]);
			double internal_weight_error = input[i] * derivation * error;
			delta_weight[i] = weight[i] * internal_weight_error;
			weight[i] += delta_weight[i] * motivation + learning_step * internal_weight_error;
			delta_bias[i] = derivation * error;
		}
		if (useBias) {
			double average_bias_error = 0.0;
			for (int i = 0; i < delta_bias.size(); i++) {
				average_bias_error += delta_bias[i];
			}average_bias_error /= delta_bias.size();
			bias += learning_step * average_bias_error;
		}
	}